

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Skeleton *skel,
               string *warn,string *err,PrimReconstructOptions *options)

{
  TypedAttributeWithFallback<tinyusdz::Purpose> *result;
  uint uVar1;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *pTVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  Property *pPVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  int iVar11;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *result_00;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *in_stack_fffffffffffffc48;
  allocator local_3a1;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *local_3a0;
  Property *local_398;
  undefined4 local_38c;
  _Base_ptr local_388;
  _Base_ptr local_380;
  ParseResult ret;
  string local_338;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ostringstream ss_e;
  code *local_278 [45];
  _Any_data local_110;
  code *local_100;
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f0;
  string local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ReconstructXformOpsFromProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)skel,err);
  if (bVar3) {
    result = &skel->purpose;
    result_00 = &skel->visibility;
    p_Var7 = (_Base_ptr)result;
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3a0 = (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 *)err;
    while( true ) {
      bVar3 = (_Rb_tree_header *)p_Var9 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      local_38c = (undefined4)CONCAT71((int7)((ulong)p_Var7 >> 8),bVar3);
      if (bVar3) break;
      p_Var7 = p_Var9 + 1;
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var7,"skel:animationSource");
      if (bVar3) {
        if ((((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) &&
           (*(int *)&p_Var9[0x17]._M_left == 1)) {
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (&skel->animationSource,(Relationship *)&p_Var9[0x17]._M_left);
          ::std::__cxx11::string::string((string *)&ss_e,"skel:animationSource",(allocator *)&ret);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_001a455a;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb67);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)&ss_e,"`");
        poVar5 = ::std::operator<<(poVar5,"skel:animationSource");
        poVar5 = ::std::operator<<(poVar5,"` must be a Relationship with Path target.");
        ::std::operator<<(poVar5,"\n");
LAB_001a554c:
        pTVar2 = local_3a0;
        if (local_3a0 !=
            (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
             *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pTVar2);
          ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_001a55a9;
      }
LAB_001a455a:
      local_380 = p_Var7;
      ::std::__cxx11::string::string(local_50,(string *)p_Var7);
      local_388 = p_Var9;
      ::std::__cxx11::string::string((string *)&ss_e,"bindTransforms",(allocator *)&local_338);
      pPVar8 = (Property *)&ss_e;
      local_398 = (Property *)(p_Var9 + 2);
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,(string *)(p_Var9 + 2),(Property *)&ss_e,
                 (string *)&skel->bindTransforms,in_stack_fffffffffffffc48);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      p_Var7 = local_388;
      iVar11 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar3 = false;
        iVar11 = 3;
      }
      else {
        bVar3 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb6d);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2a8,"Parsing attribute `{}` failed. Error: {}",&local_3a1);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_338,(fmt *)&local_2a8,(string *)"bindTransforms",(char (*) [15])&ret.err
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_338);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          pTVar2 = local_3a0;
          if (local_3a0 !=
              (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
               *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_338,&local_2a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pTVar2);
            ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_338);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar3 = false;
          iVar11 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar3) {
        ::std::__cxx11::string::string(local_70,(string *)local_380);
        ::std::__cxx11::string::string((string *)&ss_e,"joints",(allocator *)&local_338);
        pPVar8 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(string *)local_398,(Property *)&ss_e,(string *)&skel->joints,
                   (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    *)in_stack_fffffffffffffc48);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar11 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar11 = 3;
LAB_001a48e7:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb6e);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2a8,"Parsing attribute `{}` failed. Error: {}",&local_3a1);
            fmt::format<char[7],std::__cxx11::string>
                      (&local_338,(fmt *)&local_2a8,(string *)"joints",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_338);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3a0;
            if (local_3a0 !=
                (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_338,&local_2a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_338);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar11 = 1;
            goto LAB_001a48e7;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001a546a;
        ::std::__cxx11::string::string(local_90,(string *)local_380);
        ::std::__cxx11::string::string((string *)&ss_e,"jointNames",(allocator *)&local_338);
        pPVar8 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_90,(string *)local_398,(Property *)&ss_e,(string *)&skel->jointNames,
                   (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    *)in_stack_fffffffffffffc48);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar11 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar11 = 3;
LAB_001a4a9c:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb6f);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2a8,"Parsing attribute `{}` failed. Error: {}",&local_3a1);
            fmt::format<char[11],std::__cxx11::string>
                      (&local_338,(fmt *)&local_2a8,(string *)"jointNames",(char (*) [11])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_338);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3a0;
            if (local_3a0 !=
                (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_338,&local_2a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_338);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar11 = 1;
            goto LAB_001a4a9c;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001a546a;
        ::std::__cxx11::string::string(local_b0,(string *)local_380);
        ::std::__cxx11::string::string((string *)&ss_e,"restTransforms",(allocator *)&local_338);
        pPVar8 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0,(string *)local_398,(Property *)&ss_e,(string *)&skel->restTransforms
                   ,in_stack_fffffffffffffc48);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar11 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar11 = 3;
LAB_001a4c51:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb70);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2a8,"Parsing attribute `{}` failed. Error: {}",&local_3a1);
            fmt::format<char[15],std::__cxx11::string>
                      (&local_338,(fmt *)&local_2a8,(string *)"restTransforms",
                       (char (*) [15])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_338);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar2 = local_3a0;
            if (local_3a0 !=
                (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_338,&local_2a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar2);
              ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_338);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar11 = 1;
            goto LAB_001a4c51;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        p_Var9 = local_380;
        if (!bVar3) goto LAB_001a546a;
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_380,"visibility");
        if (bVar3) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          p_Var7 = local_388;
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,local_398);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&ret);
            if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb72);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar5 = ::std::operator<<(poVar5,"visibility");
                poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                ::std::operator<<(poVar5,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_338,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3a0);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&result_00->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar10 = "visibility";
LAB_001a5003:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar10,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001a5479;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            local_278[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_338);
            bVar3 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_f0,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            in_stack_fffffffffffffc48 = local_3a0;
            bVar3 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar3,&local_f0,&local_398->_attrib,result_00,warn,
                               (string *)local_3a0);
            if (local_f0.super__Function_base._M_manager != (code *)0x0) {
              (*local_f0.super__Function_base._M_manager)(&local_f0,&local_f0,3);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar11 = 1;
            if (bVar3) {
              AttrMetas::operator=(&result_00->_metas,(AttrMetas *)(p_Var7 + 7));
              pcVar10 = "visibility";
LAB_001a542e:
              ::std::__cxx11::string::string((string *)&ret,pcVar10,(allocator *)&local_338);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar11 = 3;
            }
LAB_001a5452:
            if (local_278[0] != (code *)0x0) {
              (*local_278[0])((Property *)&ss_e,(Property *)&ss_e,3);
            }
            goto LAB_001a546a;
          }
        }
        else {
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var9,"purpose");
          if (bVar3) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            p_Var7 = local_388;
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,local_398);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ss_e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ret);
              if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb74);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar5 = ::std::operator<<(poVar5,"purpose");
                  poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar5,"\n");
                  if (warn != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_338,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3a0);
                    ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var7 + 7));
                  pcVar10 = "purpose";
                  goto LAB_001a5003;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              local_278[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_338);
              bVar3 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_110,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              in_stack_fffffffffffffc48 = local_3a0;
              bVar3 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar3,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_110,&local_398->_attrib
                                 ,result,warn,(string *)local_3a0);
              if (local_100 != (code *)0x0) {
                (*local_100)(&local_110,&local_110,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar11 = 1;
              if (bVar3) {
                AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar10 = "purpose";
                goto LAB_001a542e;
              }
              goto LAB_001a5452;
            }
          }
          else {
            ::std::__cxx11::string::string((string *)&local_d0,(string *)p_Var9);
            ::std::__cxx11::string::string((string *)&ss_e,"extent",(allocator *)&local_338);
            pPVar8 = local_398;
            anon_unknown_0::ParseExtentAttribute
                      (&ret,&table,&local_d0,local_398,(string *)&ss_e,&skel->extent);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            p_Var7 = local_388;
            iVar11 = 0;
            if ((ret.code & ~AlreadyProcessed) == Success) {
              bVar3 = false;
              iVar11 = 3;
            }
            else {
              bVar3 = true;
              if (ret.code != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb75);
                ::std::operator<<(poVar5," ");
                ::std::__cxx11::string::string
                          ((string *)&local_2a8,"Parsing attribute `extent` failed. Error: {}",
                           &local_3a1);
                fmt::format<std::__cxx11::string>
                          ((string *)&local_338,(fmt *)&local_2a8,(string *)&ret.err,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar8);
                poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_338);
                ::std::operator<<(poVar5,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                pTVar2 = local_3a0;
                if (local_3a0 !=
                    (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                     *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_338,&local_2a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pTVar2);
                  ::std::__cxx11::string::operator=((string *)pTVar2,(string *)&local_338);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                bVar3 = false;
                iVar11 = 1;
              }
            }
            ::std::__cxx11::string::_M_dispose();
            p_Var9 = local_380;
            if (!bVar3) goto LAB_001a546a;
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)local_380);
            if (sVar6 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&skel->props,(key_type *)p_Var9);
              Property::operator=(this,local_398);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9
                        );
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)p_Var9);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xb77);
              ::std::operator<<(poVar5," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var9);
              poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::_M_dispose();
              goto LAB_001a554c;
            }
          }
        }
      }
      else {
LAB_001a546a:
        if ((iVar11 != 3) && (iVar11 != 0)) break;
      }
LAB_001a5479:
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
      p_Var9 = p_Var7;
    }
  }
  else {
LAB_001a55a9:
    local_38c = 0;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB41(local_38c,0);
}

Assistant:

bool ReconstructPrim<Skeleton>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Skeleton *skel,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &skel->xformOps, err)) {
    return false;
  }

  for (auto &prop : properties) {

    // SkelBindingAPI
    if (prop.first == kSkelAnimationSource) {

      // Must be relation of type Path.
      if (prop.second.is_relationship() && prop.second.get_relationship().is_path()) {
        {
          const Relationship &rel = prop.second.get_relationship();
          if (rel.is_path()) {
            skel->animationSource = rel;
            table.insert(kSkelAnimationSource);
          } else {
            PUSH_ERROR_AND_RETURN("`" << kSkelAnimationSource << "` target must be Path.");
          }
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`" << kSkelAnimationSource << "` must be a Relationship with Path target.");
      }
    }

    //

    PARSE_TYPED_ATTRIBUTE(table, prop, "bindTransforms", Skeleton, skel->bindTransforms)
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", Skeleton, skel->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "jointNames", Skeleton, skel->jointNames)
    PARSE_TYPED_ATTRIBUTE(table, prop, "restTransforms", Skeleton, skel->restTransforms)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Skeleton,
                   skel->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, Skeleton,
                       skel->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", Skeleton, skel->extent)
    ADD_PROPERTY(table, prop, Skeleton, skel->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: bindTransforms & restTransforms check somewhere.
  // usdview and Houdini USD importer expects both `bindTransforms` and `restTransforms` are authored in USD
  if (!table.count("bindTransforms")) {
    // usdview and Houdini allow `bindTransforms` is not authord in USD, but it cannot compute skinning correctly without it,
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`bindTransforms` is missing in Skeleton. Currently TinyUSDZ expects `bindTransforms` must exist in Skeleton.");
  }

  if (!table.count("restTransforms")) {
    // usdview and Houdini allow `restTransforms` is not authord in USD(usdview warns it), but it cannot compute skinning correctly without it,
    // (even SkelAnimation supplies trasnforms for all joints)
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`restTransforms`(local joint matrices at rest state) is missing in Skeleton. Currently TinyUSDZ expects `restTransforms` must exist in Skeleton.");
  }

  // len(bindTransforms) must be equal to len(restTransforms)
  // TODO: Support connection
  {
    bool valid = false;
    if (auto bt = skel->bindTransforms.get_value()) {
      if (auto rt = skel->restTransforms.get_value()) {
        if (bt.value().size() == rt.value().size()) {
          // ok
          valid = true;
        }
      }
    }

    if (!valid) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Array length must be same for `bindTransforms` and `restTransforms`.");
    }
  }
#endif

  return true;
}